

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O2

void * bad_thread(void *voidargs)

{
  fdb_kvs_handle *handle;
  fdb_iterator *iterator;
  fdb_status fVar1;
  fdb_doc local_70;
  timeval __test_begin;
  
  handle = *(fdb_kvs_handle **)((long)voidargs + 8);
  iterator = *(fdb_iterator **)((long)voidargs + 0x10);
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  local_70.key = &local_70;
  local_70.size_ondisk = 0;
  local_70.meta = (void *)0x0;
  local_70.deleted = false;
  local_70._73_3_ = 0;
  local_70.flags = 0;
  local_70.metalen = 0;
  local_70.seqnum = 0;
  local_70.offset = 0;
  local_70.keylen = 2;
  local_70.bodylen = 2;
  local_70.body = local_70.key;
  if (iterator == (fdb_iterator *)0x0) {
    fVar1 = fdb_set(handle,&local_70);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x15f);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x15f,"void *bad_thread(void *)");
    }
    fVar1 = fdb_del(handle,&local_70);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x161);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x161,"void *bad_thread(void *)");
    }
    fVar1 = fdb_get(handle,&local_70);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x163);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x163,"void *bad_thread(void *)");
    }
    fVar1 = fdb_get_metaonly(handle,&local_70);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x165);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x165,"void *bad_thread(void *)");
    }
    fVar1 = fdb_get_byseq(handle,&local_70);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x167);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x167,"void *bad_thread(void *)");
    }
    fVar1 = fdb_get_metaonly_byseq(handle,&local_70);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x169);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x169,"void *bad_thread(void *)");
    }
    local_70.offset = 5000;
    fVar1 = fdb_get_byoffset(handle,&local_70);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x16c);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x16c,"void *bad_thread(void *)");
    }
  }
  else {
    fVar1 = fdb_iterator_next(iterator);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x16f);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x16f,"void *bad_thread(void *)");
    }
    fVar1 = fdb_iterator_prev(iterator);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x171);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x171,"void *bad_thread(void *)");
    }
    fVar1 = fdb_iterator_seek_to_min(iterator);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x173);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x173,"void *bad_thread(void *)");
    }
    fVar1 = fdb_iterator_seek_to_max(iterator);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x175);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x175,"void *bad_thread(void *)");
    }
    fVar1 = fdb_iterator_seek(iterator,local_70.key,local_70.keylen,'\0');
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x177);
      __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x177,"void *bad_thread(void *)");
    }
  }
  return (void *)0x0;
}

Assistant:

void *bad_thread(void *voidargs) {
    struct shared_data *data = (struct shared_data *)voidargs;
    fdb_kvs_handle *db = data->db;
    fdb_iterator *itr = data->iterator;
    fdb_status s;
    fdb_doc doc;
    TEST_INIT();

    memset(&doc, 0, sizeof(fdb_doc));
    doc.key = &doc; // some non-null value
    doc.keylen = 2; // some non-zero value
    doc.body = &doc; // some non-null value
    doc.bodylen = 2; // some non-zero value

    if (!itr) {
        // since the parent thread is hung in the fdb_set callback
        // all the forestdb apis calls on the same handle must return failure
        s = fdb_set(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_del(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        doc.offset = 5000; // some random non-zero value
        s = fdb_get_byoffset(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    } else {
        s = fdb_iterator_next(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_prev(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_min(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_max(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek(itr, doc.key, doc.keylen, 0);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    }

    return NULL;
}